

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O1

void BDS::ComputeAofs(MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,
                     MultiFab *umac,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,
                     MultiFab *zedge,int edge_comp,bool known_edgestate,MultiFab *xfluxes,
                     MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,
                     MultiFab *divu,BCRec *d_bc,Geometry *geom,
                     Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity)

{
  int iVar1;
  pointer piVar2;
  Geometry geom_00;
  int iVar3;
  pointer iconserv_00;
  FabArray<amrex::FArrayBox> *this;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t __n;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  size_type a_capacity;
  Geometry *pGVar11;
  long lVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  undefined1 auVar21 [88];
  undefined1 auVar22 [48];
  undefined1 in_stack_fffffffffffff7f0 [160];
  undefined1 auVar23 [24];
  undefined8 in_stack_fffffffffffff890;
  Array4<const_double> *in_stack_fffffffffffff898;
  Array4<double> *in_stack_fffffffffffff8a0;
  Array4<const_double> *in_stack_fffffffffffff8a8;
  Array4<const_double> *in_stack_fffffffffffff8b0;
  int local_71c;
  ulong local_710;
  Box local_6e4;
  DeviceVector<int> iconserv_d;
  long local_6a0;
  long local_698;
  double *local_690;
  long local_688;
  long local_680;
  Array4<const_double> local_660;
  Real local_620;
  FabArray<amrex::FArrayBox> *local_618;
  long local_610;
  double *local_608;
  ulong local_600;
  long local_5f8;
  long local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_590;
  long local_588;
  long local_580;
  long local_578;
  double *local_570;
  ulong local_568;
  long local_560;
  long local_558;
  double *local_550;
  double *local_548;
  long local_540;
  long local_538;
  long local_530;
  long local_528;
  long local_520;
  Array4<const_double> local_518;
  Array4<const_double> local_4d8;
  Array4<double> local_498;
  Array4<double> local_458;
  Array4<double> local_418;
  Array<const_MultiFab_*,_3> u;
  int local_3b0;
  Array4<double> local_370;
  Array4<double> local_330;
  Array4<double> local_2f0;
  Array4<const_double> local_2b0;
  Array4<const_double> local_270;
  Array4<const_double> local_230;
  Array4<const_double> local_1f0;
  MultiFab divu_mac;
  
  bVar20 = 0;
  uVar18 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish -
           (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start >> 2;
  iconserv_d.m_data = (pointer)0x0;
  iconserv_d.m_size = 0;
  iconserv_d.m_capacity = 0;
  a_capacity = 0x10;
  if (0x10 < uVar18) {
    do {
      a_capacity = a_capacity * 3 + 1 >> 1;
    } while (a_capacity < uVar18);
  }
  local_620 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::AllocateBuffer(&iconserv_d,a_capacity);
  piVar2 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar2;
  iconserv_d.m_size = uVar18;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar2,__n);
  }
  iconserv_00 = iconserv_d.m_data;
  u._M_elems[0] = (MultiFab *)0x1;
  u._M_elems[1] = (MultiFab *)0x0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_370.p = (double *)&PTR__FabFactory_0074e8d0;
  amrex::MultiFab::MultiFab
            (&divu_mac,&(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,0,
             (MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar2 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar2 >> 2;
  if (0 < lVar6) {
    lVar7 = 0;
    do {
      if (piVar2[lVar7] == 0) {
        u._M_elems[1] = vmac;
        u._M_elems[2] = wmac;
        u._M_elems[0] = umac;
        amrex::computeDivergence(&divu_mac,&u,geom);
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  local_618 = &aofs->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  uVar4 = (ulong)(uint)ncomp;
  uVar18 = local_600;
  while (local_600 = uVar4, 0 < local_3b0) {
    amrex::MFIter::tilebox(&local_6e4,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_370,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2f0,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_330,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_418,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_458,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_498,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_1f0,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_230,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_270,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    if (!known_edgestate) {
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_4d8,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,state_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_660,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_518,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
      pGVar11 = geom;
      puVar13 = (undefined8 *)&stack0xfffffffffffff7f0;
      for (lVar6 = 0x19; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar13 = *(undefined8 *)&pGVar11->super_CoordSys;
        pGVar11 = (Geometry *)((long)pGVar11 + (ulong)bVar20 * -0x10 + 8);
        puVar13 = puVar13 + (ulong)bVar20 * -2 + 1;
      }
      geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffff890;
      geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffff890 >> 0x20);
      auVar21 = in_stack_fffffffffffff7f0._0_88_;
      auVar22 = in_stack_fffffffffffff7f0._88_48_;
      auVar23 = in_stack_fffffffffffff7f0._136_24_;
      geom_00.super_CoordSys.c_sys = auVar21._0_4_;
      geom_00.super_CoordSys._4_4_ = auVar21._4_4_;
      geom_00.super_CoordSys.offset[0] = (Real)auVar21._8_8_;
      geom_00.super_CoordSys.offset[1] = (Real)auVar21._16_8_;
      geom_00.super_CoordSys.offset[2] = (Real)auVar21._24_8_;
      geom_00.super_CoordSys.dx[0] = (Real)auVar21._32_8_;
      geom_00.super_CoordSys.dx[1] = (Real)auVar21._40_8_;
      geom_00.super_CoordSys.dx[2] = (Real)auVar21._48_8_;
      geom_00.super_CoordSys.inv_dx[0] = (Real)auVar21._56_8_;
      geom_00.super_CoordSys.inv_dx[1] = (Real)auVar21._64_8_;
      geom_00.super_CoordSys.inv_dx[2] = (Real)auVar21._72_8_;
      geom_00.super_CoordSys.ok = (bool)auVar21[0x50];
      geom_00.super_CoordSys._81_7_ = auVar21._81_7_;
      geom_00.prob_domain.xlo[0] = (Real)auVar22._0_8_;
      geom_00.prob_domain.xlo[1] = (Real)auVar22._8_8_;
      geom_00.prob_domain.xlo[2] = (Real)auVar22._16_8_;
      geom_00.prob_domain.xhi[0] = (Real)auVar22._24_8_;
      geom_00.prob_domain.xhi[1] = (Real)auVar22._32_8_;
      geom_00.prob_domain.xhi[2] = (Real)auVar22._40_8_;
      geom_00.roundoff_hi_d.arr[0] = (double)auVar23._0_8_;
      geom_00.roundoff_hi_d.arr[1] = (double)auVar23._8_8_;
      geom_00.roundoff_hi_d.arr[2] = (double)auVar23._16_8_;
      geom_00._168_8_ = in_stack_fffffffffffff898;
      geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff8a0;
      geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff8a8;
      geom_00.domain._20_8_ = in_stack_fffffffffffff8b0;
      ComputeEdgeState(&local_6e4,ncomp,&local_4d8,&local_418,&local_458,&local_498,&local_1f0,
                       &local_230,&local_270,&local_660,&local_518,geom_00,local_620,d_bc,
                       iconserv_00,is_velocity);
    }
    in_stack_fffffffffffff898 = &local_270;
    local_4d8.p = local_418.p;
    local_4d8.jstride = local_418.jstride;
    local_4d8.kstride = local_418.kstride;
    local_4d8.nstride = local_418.nstride;
    local_4d8.begin.z = local_418.begin.z;
    local_4d8.begin.x = local_418.begin.x;
    local_4d8.begin.y = local_418.begin.y;
    local_4d8.end.z = local_418.end.z;
    local_4d8.end.x = local_418.end.x;
    local_4d8.end.y = local_418.end.y;
    local_4d8.ncomp = local_418.ncomp;
    local_660.p = local_458.p;
    local_660.jstride = local_458.jstride;
    local_660.kstride = local_458.kstride;
    local_660.nstride = local_458.nstride;
    local_660.begin.z = local_458.begin.z;
    local_660.end.z = local_458.end.z;
    local_660.end.x = local_458.end.x;
    local_660.end.y = local_458.end.y;
    local_660.ncomp = local_458.ncomp;
    local_518.p = local_498.p;
    local_518.jstride = local_498.jstride;
    local_518.kstride = local_498.kstride;
    local_518.nstride = local_498.nstride;
    local_518.begin.z = local_498.begin.z;
    local_518.end.z = local_498.end.z;
    local_518.end.x = local_498.end.x;
    local_518.end.y = local_498.end.y;
    local_518.ncomp = local_498.ncomp;
    in_stack_fffffffffffff8b0 = &local_518;
    in_stack_fffffffffffff8a8 = &local_660;
    in_stack_fffffffffffff890 = 0x2ce1bb;
    in_stack_fffffffffffff8a0 = (Array4<double> *)&local_4d8;
    HydroUtils::ComputeFluxes
              (&local_6e4,&local_370,&local_2f0,&local_330,&local_1f0,&local_230,
               in_stack_fffffffffffff898,&local_4d8,in_stack_fffffffffffff8a8,
               in_stack_fffffffffffff8b0,geom,ncomp,true);
    this = local_618;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_4d8,local_618,(MFIter *)&u,aofs_comp);
    local_660.p = local_370.p;
    local_660.jstride = local_370.jstride;
    local_660.kstride = local_370.kstride;
    local_660.nstride = local_370.nstride;
    local_660.begin.z = local_370.begin.z;
    local_660.begin.x = local_370.begin.x;
    local_660.begin.y = local_370.begin.y;
    local_660.end.z = local_370.end.z;
    local_660.end.x = local_370.end.x;
    local_660.end.y = local_370.end.y;
    local_660.ncomp = local_370.ncomp;
    local_518.p = local_2f0.p;
    local_518.jstride = local_2f0.jstride;
    local_518.kstride = local_2f0.kstride;
    local_518.nstride = local_2f0.nstride;
    local_518.begin.z = local_2f0.begin.z;
    local_518.begin.x = local_2f0.begin.x;
    local_518.begin.y = local_2f0.begin.y;
    local_518.end.z = local_2f0.end.z;
    local_518.end.x = local_2f0.end.x;
    local_518.end.y = local_2f0.end.y;
    local_518.ncomp = local_2f0.ncomp;
    local_2b0.p = local_330.p;
    local_2b0.jstride = local_330.jstride;
    local_2b0.kstride = local_330.kstride;
    local_2b0.nstride = local_330.nstride;
    local_2b0.begin.z = local_330.begin.z;
    local_2b0.begin.x = local_330.begin.x;
    local_2b0.begin.y = local_330.begin.y;
    local_2b0.end.z = local_330.end.z;
    local_2b0.end.x = local_330.end.x;
    local_2b0.end.y = local_330.end.y;
    local_2b0.ncomp = local_330.ncomp;
    HydroUtils::ComputeDivergence
              (&local_6e4,(Array4<double> *)&local_4d8,&local_660,&local_518,&local_2b0,ncomp,geom,
               -1.0,true);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_4d8,this,(MFIter *)&u,aofs_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_660,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
    ;
    if (0 < ncomp) {
      lVar7 = (long)local_6e4.smallend.vect[1];
      local_538 = (long)local_6e4.smallend.vect[0];
      local_528 = local_4d8.jstride * 8;
      local_558 = (long)local_418.begin.y;
      local_530 = local_660.jstride * 8;
      local_520 = local_498.jstride * 8;
      lVar6 = local_458.jstride * 8;
      local_690 = local_458.p + (local_538 - local_458.begin.x);
      local_698 = (lVar7 - local_458.begin.y) * lVar6 + local_538 * 8 + (long)local_458.begin.x * -8
                  + (long)local_458.p;
      local_560 = local_418.jstride;
      local_540 = local_418.jstride * 8;
      local_680 = (lVar7 - local_4d8.begin.y) * local_528 + local_538 * 8 +
                  (long)local_4d8.begin.x * -8 + (long)local_4d8.p;
      local_5e0 = local_4d8.nstride * 8;
      local_580 = local_4d8.kstride * 8;
      local_588 = -(long)local_4d8.begin.z;
      local_578 = (lVar7 - local_660.begin.y) * local_530 + local_538 * 8 +
                  (long)local_660.begin.x * -8 + (long)local_660.p;
      local_590 = local_660.kstride * 8;
      local_688 = (lVar7 - local_498.begin.y) * local_520 + local_538 * 8 +
                  (long)local_498.begin.x * -8 + (long)local_498.p;
      local_598 = -(long)local_660.begin.z;
      local_5e8 = local_498.nstride * 8;
      local_5a0 = local_498.kstride * 8;
      local_5a8 = -(long)local_498.begin.z;
      local_5f0 = local_458.nstride * 8;
      local_5b0 = local_458.kstride * 8;
      local_5b8 = -(long)local_458.begin.z;
      local_608 = local_418.p;
      local_6a0 = (lVar7 - local_558) * local_540 + local_538 * 8 + (long)local_418.begin.x * -8 +
                  (long)local_418.p;
      local_5c0 = (long)local_418.begin.z;
      local_5c8 = -local_5c0;
      local_568 = (ulong)(uint)local_6e4.bigend.vect[1];
      local_610 = local_418.nstride;
      local_5f8 = local_418.nstride * 8;
      local_5d0 = local_418.kstride;
      local_5d8 = local_418.kstride * 8;
      local_710 = 0;
      do {
        if (local_6e4.smallend.vect[2] <= local_6e4.bigend.vect[2]) {
          local_570 = local_418.p + local_710 * local_418.nstride;
          iVar3 = local_6e4.smallend.vect[2];
          local_71c = local_6e4.smallend.vect[2] - local_498.begin.z;
          do {
            local_71c = local_71c + 1;
            if (local_6e4.smallend.vect[1] <= local_6e4.bigend.vect[1]) {
              lVar5 = (long)iVar3;
              lVar15 = (local_588 + lVar5) * local_580 + local_680;
              lVar16 = (local_598 + lVar5) * local_590 + local_578;
              lVar17 = local_71c * local_5a0 + local_688;
              lVar9 = (local_5a8 + lVar5) * local_5a0 + local_688;
              lVar8 = (local_5b8 + lVar5) * local_5b0;
              lVar12 = local_698 + lVar8;
              lVar14 = (local_5c8 + lVar5) * local_5d8 + local_6a0;
              local_550 = local_570 + (iVar3 - local_418.begin.z) * local_418.kstride;
              local_548 = (double *)(lVar8 + (long)local_690);
              lVar5 = lVar7;
              iVar10 = local_6e4.smallend.vect[1] - local_458.begin.y;
              do {
                iVar10 = iVar10 + 1;
                if (local_6e4.smallend.vect[0] <= local_6e4.bigend.vect[0]) {
                  iVar1 = iconserv_00[local_710];
                  lVar8 = 0;
                  do {
                    if (iVar1 == 0) {
                      *(double *)(lVar15 + lVar8 * 8) =
                           ((*(double *)(lVar9 + lVar8 * 8) + *(double *)(lVar17 + lVar8 * 8) +
                            *(double *)(lVar14 + lVar8 * 8) +
                            local_550[(lVar5 - local_558) * local_418.jstride +
                                      (long)((local_6e4.smallend.vect[0] - local_418.begin.x) + 1 +
                                            (int)lVar8)] + *(double *)(lVar12 + lVar8 * 8) +
                            *(double *)((long)local_548 + lVar8 * 8 + iVar10 * lVar6)) / 6.0) *
                           *(double *)(lVar16 + lVar8 * 8) + *(double *)(lVar15 + lVar8 * 8);
                    }
                    *(ulong *)(lVar15 + lVar8 * 8) =
                         *(ulong *)(lVar15 + lVar8 * 8) ^ 0x8000000000000000;
                    lVar8 = lVar8 + 1;
                  } while ((local_6e4.bigend.vect[0] - local_6e4.smallend.vect[0]) + 1 != (int)lVar8
                          );
                }
                lVar5 = lVar5 + 1;
                lVar15 = lVar15 + local_528;
                lVar16 = lVar16 + local_530;
                lVar17 = lVar17 + local_520;
                lVar9 = lVar9 + local_520;
                lVar12 = lVar12 + lVar6;
                lVar14 = lVar14 + local_540;
              } while (local_6e4.bigend.vect[1] + 1U != (int)lVar5);
            }
            bVar19 = iVar3 != local_6e4.bigend.vect[2];
            iVar3 = iVar3 + 1;
          } while (bVar19);
        }
        local_710 = local_710 + 1;
        local_680 = local_680 + local_5e0;
        local_688 = local_688 + local_5e8;
        local_690 = local_690 + local_458.nstride;
        local_698 = local_698 + local_5f0;
        local_6a0 = local_6a0 + local_5f8;
      } while (local_710 != local_600);
    }
    amrex::Gpu::Device::streamSynchronize();
    amrex::MFIter::operator++((MFIter *)&u);
    uVar4 = local_600;
    uVar18 = local_600;
  }
  local_600 = uVar18;
  amrex::MFIter::~MFIter((MFIter *)&u);
  amrex::MultiFab::~MultiFab(&divu_mac);
  if (iconserv_d.m_data != (pointer)0x0) {
    operator_delete(iconserv_d.m_data,iconserv_d.m_capacity << 2);
  }
  return;
}

Assistant:

void
BDS::ComputeAofs ( MultiFab& aofs,
                   const int aofs_comp,
                   const int ncomp,
                   MultiFab const& state,
                   const int state_comp,
                   AMREX_D_DECL( MultiFab const& umac,
                                 MultiFab const& vmac,
                                 MultiFab const& wmac),
                   AMREX_D_DECL( MultiFab& xedge,
                                 MultiFab& yedge,
                                 MultiFab& zedge),
                   const int  edge_comp,
                   const bool known_edgestate,
                   AMREX_D_DECL( MultiFab& xfluxes,
                                 MultiFab& yfluxes,
                                 MultiFab& zfluxes),
                   int fluxes_comp,
                   MultiFab const& fq,
                   const int fq_comp,
                   MultiFab const& divu,
                   BCRec const* d_bc,
                   Geometry const& geom,
                   Vector<int>& iconserv,
                   const Real dt,
                   const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    // If we need convective form, we must also compute div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0);;
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);
            amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

        if ( !known_edgestate ) {
            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed, yed, zed),
                                   AMREX_D_DECL(u, v, w),
                                   divu.array(mfi),
                                   fq.array(mfi, fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }



        // Compute -div instead of computing div -- this is just for consistency
        // with the way we HAVE to do it for EB (because redistribution operates on
        // -div rather than div)
        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( u, v, w ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx,
                                       aofs.array(mfi,aofs_comp),
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);


        // Compute the convective form if needed and
        // flip the sign to return div
        auto const& aofs_arr  = aofs.array(mfi, aofs_comp);
        auto const& divu_arr  = divu_mac.array(mfi);
        amrex::ParallelFor(bx, ncomp, [=]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (!iconserv_ptr[n])
            {
                Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                       + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                q *= 0.25;
#else
                q += zed(i,j,k,n) + zed(i,j,k+1,n);
                q /= 6.0;
#endif
                aofs_arr(i,j,k,n) += q*divu_arr(i,j,k);
            }

            aofs_arr( i, j, k, n ) *=  - 1.0;
        });

        //
        // NOTE this sync cannot protect temporaries in ComputeEdgeState, ComputeFluxes
        // or ComputeDivergence, since functions have their own scope. As soon as the
        // CPU hits the end of the function, it will call the destructor for all
        // temporaries created in that function.
        //
        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}